

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

reference __thiscall
nonstd::span_lite::span<char,_18446744073709551615UL>::operator[]
          (span<char,_18446744073709551615UL> *this,size_type idx)

{
  contract_violation *this_00;
  
  if (idx < this->size_) {
    return this->data_ + idx;
  }
  this_00 = (contract_violation *)__cxa_allocate_exception(0x10);
  detail::contract_violation::contract_violation
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1241: Precondition violation."
            );
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr_exp reference operator[]( size_type idx ) const
    {
        span_EXPECTS( detail::is_positive( idx ) && idx < size() );

        return *( data() + idx );
    }